

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O1

XrResult RuntimeManifestFile::FindManifestFiles
                   (string *openxr_command,
                   vector<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>,_std::allocator<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>_>_>
                   *manifest_files)

{
  bool bVar1;
  bool bVar2;
  pointer pXVar3;
  istream *piVar4;
  char *out;
  string *psVar5;
  XrResult XVar6;
  string dir_prefix;
  string filename;
  string message;
  istringstream iss;
  string local_268;
  undefined1 local_248 [40];
  string local_220;
  string *local_200;
  string **local_1f8;
  string *local_1f0;
  string *local_1e8 [2];
  pointer local_1d8;
  pointer local_1d0;
  undefined1 local_1c8 [16];
  _Alloc_hider local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_200 = openxr_command;
  local_1b8._M_p = (pointer)manifest_files;
  PlatformUtilsGetSecureEnv_abi_cxx11_(&local_220,"XR_RUNTIME_JSON");
  if (local_220._M_string_length == 0) {
    local_1f8 = local_1e8;
    local_1b0._0_8_ = (string *)0x3d;
    local_1f8 = (string **)std::__cxx11::string::_M_create((ulong *)&local_1f8,(ulong)local_1b0);
    local_1e8[0] = (string *)local_1b0._0_8_;
    builtin_strncpy((char *)((long)local_1f8 + 0x2d),"ive_runt",8);
    builtin_strncpy((char *)((long)local_1f8 + 0x35),"ime.json",8);
    local_1f8[4] = (string *)0x6f206e6f736a2e34;
    local_1f8[5] = (string *)0x6576697463612072;
    local_1f8[2] = (string *)0x69746e75725f6576;
    local_1f8[3] = (string *)0x365f3638782e656d;
    *local_1f8 = (string *)0x20676e696b6f6f4c;
    local_1f8[1] = (string *)0x6974636120726f66;
    local_1f0 = (string *)local_1b0._0_8_;
    *(char *)((long)local_1f8 + local_1b0._0_8_) = '\0';
    psVar5 = (string *)local_1b0._0_8_;
    PlatformUtilsGetSecureEnv_abi_cxx11_(&local_268,"XDG_CONFIG_HOME");
    if ((char *)local_268._M_string_length == (char *)0x0) {
      PlatformUtilsGetSecureEnv_abi_cxx11_((string *)local_1b0,"HOME");
      std::__cxx11::string::operator=((string *)&local_268,(string *)local_1b0);
      if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      if ((char *)local_268._M_string_length != (char *)0x0) {
        std::__cxx11::string::append((char *)&local_268);
        std::__cxx11::string::append((char *)&local_268);
      }
    }
    if ((char *)local_268._M_string_length == (char *)0x0) {
LAB_0011685b:
      PlatformUtilsGetSecureEnv_abi_cxx11_((string *)local_248,"XDG_CONFIG_DIRS");
      local_1d8 = (pointer)local_1c8;
      if ((pointer)local_248._8_8_ == (pointer)0x0) {
        pXVar3 = (pointer)(local_1c8 + 8);
        local_1c8._0_8_ = (pointer)0x6764782f6374652f;
        local_1d0 = (pointer)0x8;
      }
      else {
        pXVar3 = (pointer)(local_248 + 0x10);
        if ((pointer)local_248._0_8_ == pXVar3) {
          local_1c8._8_8_ = local_248._24_8_;
        }
        else {
          local_1d8 = (pointer)local_248._0_8_;
        }
        local_1c8._0_8_ = local_248._16_8_;
        local_1d0 = (pointer)local_248._8_8_;
        local_248._8_8_ = (pointer)0x0;
        local_248._0_8_ = pXVar3;
      }
      *(undefined1 *)&pXVar3->handle = 0;
      if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
      }
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_1b0,(string *)&local_1d8,_S_in);
      if (local_1d8 != (pointer)local_1c8) {
        operator_delete(local_1d8,(ulong)((long)(uint64_t *)local_1c8._0_8_ + 1));
      }
      local_248._8_8_ = (pointer)0x0;
      local_248._16_8_ = local_248._16_8_ & 0xffffffffffffff00;
      local_248._0_8_ = (pointer)(local_248 + 0x10);
      do {
        do {
          piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_1b0,(string *)local_248,':');
          psVar5 = *(string **)(*(long *)piVar4 + -0x18);
          if (((byte)(piVar4 + 0x20)[(long)psVar5] & 5) != 0) {
            out = "/usr/local/etc";
            std::__cxx11::string::_M_replace
                      ((ulong)&local_268,0,(char *)local_268._M_string_length,0x13c9d1);
            std::__cxx11::string::append((char *)&local_268);
            std::__cxx11::string::append((char *)&local_268);
            bVar1 = FindEitherActiveRuntimeFilename
                              ("compiled-in SYSCONFDIR",&local_268,(uint16_t)&local_220,
                               (string *)out);
            bVar2 = true;
            if (!bVar1) {
              psVar5 = (string *)0x13c9db;
              std::__cxx11::string::_M_replace
                        ((ulong)&local_268,0,(char *)local_268._M_string_length,0x13c9db);
              std::__cxx11::string::append((char *)&local_268);
              std::__cxx11::string::append((char *)&local_268);
              bVar1 = FindEitherActiveRuntimeFilename
                                ("compiled-in EXTRASYSCONFDIR",&local_268,(uint16_t)&local_220,
                                 psVar5);
              if (!bVar1) {
                local_220._M_string_length = 0;
                *local_220._M_dataplus._M_p = '\0';
                bVar2 = false;
              }
            }
            goto LAB_00116a87;
          }
        } while ((pointer)local_248._8_8_ == (pointer)0x0);
        std::__cxx11::string::operator=((string *)&local_268,(string *)local_248);
        std::__cxx11::string::append((char *)&local_268);
        std::__cxx11::string::append((char *)&local_268);
        bVar2 = FindEitherActiveRuntimeFilename
                          ("an entry of XDG_CONFIG_DIRS",&local_268,(uint16_t)&local_220,psVar5);
      } while (!bVar2);
      bVar2 = true;
LAB_00116a87:
      if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::ios_base::~ios_base(local_138);
    }
    else {
      std::__cxx11::string::append((char *)&local_268);
      std::__cxx11::string::append((char *)&local_268);
      bVar1 = FindEitherActiveRuntimeFilename
                        ("XDG_CONFIG_HOME",&local_268,(uint16_t)&local_220,psVar5);
      bVar2 = true;
      if (!bVar1) goto LAB_0011685b;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,(ulong)((long)&(local_1e8[0]->_M_dataplus)._M_p + 1));
    }
    if (!bVar2) {
      local_1b0._0_8_ = (string *)(local_1b0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,
                 "RuntimeManifestFile::FindManifestFiles - failed to determine active runtime file path for this environment"
                 ,"");
      local_248._0_8_ = (pointer)0x0;
      local_248._8_8_ = (pointer)0x0;
      local_248._16_8_ = (pointer)0x0;
      LoaderLogger::LogErrorMessage
                (local_200,(string *)local_1b0,
                 (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_248);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_248);
      if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      XVar6 = XR_ERROR_RUNTIME_UNAVAILABLE;
      goto LAB_00116b19;
    }
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                   "RuntimeManifestFile::FindManifestFiles - using environment variable override runtime file "
                   ,&local_220);
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = (pointer)0x0;
    local_248._16_8_ = (pointer)0x0;
    LoaderLogger::LogInfoMessage
              (local_200,(string *)local_1b0,
               (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_248);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
              ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_248);
    if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
  }
  XVar6 = XR_SUCCESS;
  CreateIfValid(&local_220,
                (vector<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>,_std::allocator<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>_>_>
                 *)local_1b8._M_p);
LAB_00116b19:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  return XVar6;
}

Assistant:

XrResult RuntimeManifestFile::FindManifestFiles(const std::string &openxr_command,
                                                std::vector<std::unique_ptr<RuntimeManifestFile>> &manifest_files) {
    XrResult result = XR_SUCCESS;
    std::string filename = PlatformUtilsGetSecureEnv(OPENXR_RUNTIME_JSON_ENV_VAR);
    if (!filename.empty()) {
        LoaderLogger::LogInfoMessage(
            openxr_command,
            "RuntimeManifestFile::FindManifestFiles - using environment variable override runtime file " + filename);
    } else {
#ifdef XR_OS_WINDOWS
        std::vector<std::string> filenames;
        ReadRuntimeDataFilesInRegistry("", "ActiveRuntime", filenames);
        if (filenames.size() == 0) {
            LoaderLogger::LogErrorMessage(
                openxr_command, "RuntimeManifestFile::FindManifestFiles - failed to find active runtime file in registry");
            return XR_ERROR_RUNTIME_UNAVAILABLE;
        }
        if (filenames.size() > 1) {
            LoaderLogger::LogWarningMessage(
                openxr_command, "RuntimeManifestFile::FindManifestFiles - found too many default runtime files in registry");
        }
        filename = filenames[0];
        LoaderLogger::LogInfoMessage(openxr_command,
                                     "RuntimeManifestFile::FindManifestFiles - using registry-specified runtime file " + filename);
#elif defined(XR_OS_LINUX)

        if (!FindXDGConfigFile("openxr/", XR_VERSION_MAJOR(XR_CURRENT_API_VERSION), filename)) {
            LoaderLogger::LogErrorMessage(
                openxr_command,
                "RuntimeManifestFile::FindManifestFiles - failed to determine active runtime file path for this environment");
            return XR_ERROR_RUNTIME_UNAVAILABLE;
        }
#else  // !defined(XR_OS_WINDOWS) && !defined(XR_OS_LINUX)

#if defined(XR_KHR_LOADER_INIT_SUPPORT) && defined(XR_USE_PLATFORM_ANDROID)
        Json::Value virtualManifest;
        result = GetPlatformRuntimeVirtualManifest(virtualManifest);
        if (XR_SUCCESS == result) {
            RuntimeManifestFile::CreateIfValid(virtualManifest, "", manifest_files);
            return result;
        }
#endif  // defined(XR_USE_PLATFORM_ANDROID) && defined(XR_KHR_LOADER_INIT_SUPPORT)
        if (!PlatformGetGlobalRuntimeFileName(XR_VERSION_MAJOR(XR_CURRENT_API_VERSION), filename)) {
            LoaderLogger::LogErrorMessage(
                openxr_command,
                "RuntimeManifestFile::FindManifestFiles - failed to determine active runtime file path for this environment");
            return XR_ERROR_RUNTIME_UNAVAILABLE;
        }
        result = XR_SUCCESS;
        LoaderLogger::LogInfoMessage(openxr_command,
                                     "RuntimeManifestFile::FindManifestFiles - using global runtime file " + filename);
#endif  // !defined(XR_OS_WINDOWS) && !defined(XR_OS_LINUX)
    }
    RuntimeManifestFile::CreateIfValid(filename, manifest_files);

    return result;
}